

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontNonSym.cpp
# Opt level: O2

void TPZFrontNonSym<std::complex<float>_>::main(void)

{
  long col;
  int iVar1;
  complex<float> *pcVar2;
  complex<float> *pcVar3;
  long lVar4;
  long lVar5;
  TPZVec<long> DestIndex;
  string OutFile;
  TPZFMatrix<std::complex<float>_> Load_2;
  TPZFMatrix<std::complex<float>_> Load;
  TPZFMatrix<std::complex<float>_> Prova;
  TPZFMatrix<std::complex<float>_> TestMatrix;
  TPZFrontNonSym<std::complex<float>_> TestFront;
  ofstream outeqn;
  ofstream output;
  TPZEqnArray<std::complex<float>_> Result;
  
  TPZFMatrix<std::complex<float>_>::TPZFMatrix(&TestMatrix,6,6);
  for (lVar5 = 0; lVar5 != 6; lVar5 = lVar5 + 1) {
    for (lVar4 = 0; col = lVar5 + lVar4, col != 6; lVar4 = lVar4 + 1) {
      iVar1 = rand();
      pcVar2 = TPZFMatrix<std::complex<float>_>::operator()(&TestMatrix,lVar5,col);
      *(float *)&pcVar2->_M_value = (float)((iVar1 * 6) / 0x7fff);
      *(undefined4 *)((long)&pcVar2->_M_value + 4) = 0;
      pcVar2 = TPZFMatrix<std::complex<float>_>::operator()(&TestMatrix,lVar5,col);
      pcVar3 = TPZFMatrix<std::complex<float>_>::operator()(&TestMatrix,col,lVar5);
      pcVar3->_M_value = pcVar2->_M_value;
      if (lVar4 == 0) {
        pcVar2 = TPZFMatrix<std::complex<float>_>::operator()(&TestMatrix,lVar5,lVar5);
        pcVar2->_M_value = 0x45bb8000;
      }
    }
  }
  TPZFMatrix<std::complex<float>_>::TPZFMatrix(&Prova);
  TPZFMatrix<std::complex<float>_>::operator=(&Prova,&TestMatrix);
  TPZMatrix<std::complex<float>_>::Print
            (&Prova.super_TPZMatrix<std::complex<float>_>,"TPZFMatrix<TVar> Cholesky",
             (ostream *)&std::cout,EFormatted);
  TPZFrontNonSym(&TestFront,6);
  TPZVec<long>::TPZVec(&DestIndex,6);
  for (lVar5 = 0; lVar5 != 6; lVar5 = lVar5 + 1) {
    DestIndex.fStore[lVar5] = lVar5;
  }
  SymbolicAddKel(&TestFront,&DestIndex);
  SymbolicDecomposeEquations(&TestFront,0,5);
  OutFile._M_dataplus._M_p = (pointer)&OutFile.field_2;
  OutFile._M_string_length = 0;
  OutFile.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::assign((char *)&OutFile);
  std::ofstream::ofstream(&output,OutFile._M_dataplus._M_p,_S_app);
  Compress(&TestFront);
  AllocData(&TestFront);
  AddKel(&TestFront,&TestMatrix,&DestIndex);
  TPZEqnArray<std::complex<float>_>::TPZEqnArray(&Result);
  DecomposeEquations(&TestFront,0,5,&Result);
  std::ofstream::ofstream(&outeqn,"TestEQNArray.txt",_S_app);
  TPZEqnArray<std::complex<float>_>::Print(&Result,"TestEQNArray.txt",(ostream *)&outeqn);
  TPZFMatrix<std::complex<float>_>::TPZFMatrix(&Load,6,1);
  for (lVar5 = 0; lVar5 != 6; lVar5 = lVar5 + 1) {
    iVar1 = rand();
    pcVar2 = TPZFMatrix<std::complex<float>_>::operator()(&Load,lVar5,0);
    *(float *)&pcVar2->_M_value = (float)((iVar1 * 6) / 0x7fff);
    *(undefined4 *)((long)&pcVar2->_M_value + 4) = 0;
  }
  TPZFMatrix<std::complex<float>_>::TPZFMatrix(&Load_2,6,1);
  TPZFMatrix<std::complex<float>_>::operator=(&Load_2,&Load);
  TPZMatrix<std::complex<float>_>::SolveDirect
            (&Prova.super_TPZMatrix<std::complex<float>_>,&Load,ECholesky);
  TPZMatrix<std::complex<float>_>::Print
            (&Load.super_TPZMatrix<std::complex<float>_>,"Load",(ostream *)&std::cout,EFormatted);
  TPZEqnArray<std::complex<float>_>::EqnForward(&Result,&Load_2,ECholesky);
  TPZEqnArray<std::complex<float>_>::EqnBackward(&Result,&Load_2,ECholesky);
  TPZMatrix<std::complex<float>_>::Print
            (&Load_2.super_TPZMatrix<std::complex<float>_>,"Eqn",(ostream *)&std::cout,EFormatted);
  TPZFMatrix<std::complex<float>_>::~TPZFMatrix(&Load_2);
  TPZFMatrix<std::complex<float>_>::~TPZFMatrix(&Load);
  std::ofstream::~ofstream(&outeqn);
  TPZEqnArray<std::complex<float>_>::~TPZEqnArray(&Result);
  std::ofstream::~ofstream(&output);
  std::__cxx11::string::~string((string *)&OutFile);
  TPZVec<long>::~TPZVec(&DestIndex);
  ~TPZFrontNonSym(&TestFront);
  TPZFMatrix<std::complex<float>_>::~TPZFMatrix(&Prova);
  TPZFMatrix<std::complex<float>_>::~TPZFMatrix(&TestMatrix);
  return;
}

Assistant:

void TPZFrontNonSym<TVar>::main()
{
	int i, j;
	/**
	 * 	Populates data structure
	 */
	int matsize=6;
	TPZFMatrix<TVar> TestMatrix(matsize,matsize);
	for(i=0;i<matsize;i++) {
		for(j=i;j<matsize;j++) {
			int random = rand();
			double rnd = (random*matsize)/0x7fff;
			TestMatrix(i,j)=rnd;
			TestMatrix(j,i)=TestMatrix(i,j);
			if(i==j) TestMatrix(i,j)=6000.;
		}
	}
	
	TPZFMatrix<TVar> Prova;
	Prova=TestMatrix;
	
	//	Prova.Decompose_Cholesky();
	Prova.Print("TPZFMatrix<TVar> Cholesky");
	
	TPZFrontNonSym TestFront(matsize);
	
	
	TPZVec<int64_t> DestIndex(matsize);
	for(i=0;i<matsize;i++) DestIndex[i]=i;
	
	TestFront.SymbolicAddKel(DestIndex);
	TestFront.SymbolicDecomposeEquations(0,matsize-1); 
	
	std::string OutFile;
	OutFile = "TPZFrontNonSymTest.txt";
	
	ofstream output(OutFile.c_str(),ios::app);
	
	TestFront.Compress();
	
	TestFront.AllocData();
	
	TestFront.AddKel(TestMatrix, DestIndex);
	TPZEqnArray<TVar> Result;

	TestFront.DecomposeEquations(0,matsize-1,Result);
	ofstream outeqn("TestEQNArray.txt",ios::app);
	
	Result.Print("TestEQNArray.txt",outeqn);
	
	
	TPZFMatrix<TVar> Load(matsize);
	
	for(i=0;i<matsize;i++) {
		int random = rand();
		double rnd = (random*matsize)/0x7fff;
		Load(i,0)=rnd;
	}
	
	TPZFMatrix<TVar> Load_2(matsize);
	Load_2=Load;
	
	DecomposeType decType = ECholesky;
	Prova.SolveDirect(Load, decType);
	
	Load.Print("Load");
	//TestFront.Print(OutFile, output);
	
	Result.EqnForward(Load_2, decType);
	Result.EqnBackward(Load_2, decType);
	
	Load_2.Print("Eqn");
}